

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O3

char * mk_filename(uint32 type,char *rel_path)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  char *pcVar5;
  
  pcVar4 = data_dir[type];
  pcVar5 = extension[type];
  if (pcVar5 != (char *)0x0 && pcVar4 != (char *)0x0) {
    pcVar3 = rel_path;
    if (is_flat[type] != 0) {
      pcVar2 = strrchr(rel_path,0x2f);
      pcVar3 = pcVar2 + 1;
      if (pcVar2 == (char *)0x0) {
        pcVar3 = rel_path;
      }
    }
    iVar1 = sprintf(mk_filename::fn,"%s/%s.%s",pcVar4,pcVar3,pcVar5);
    return (char *)CONCAT44(extraout_var,iVar1);
  }
  if (pcVar4 == (char *)0x0) {
    if (pcVar5 == (char *)0x0) {
      pcVar4 = strcpy(mk_filename::fn,rel_path);
      return pcVar4;
    }
    pcVar3 = "%s.%s";
  }
  else if (is_flat[type] == 0) {
    pcVar3 = "%s/%s";
    pcVar5 = rel_path;
    rel_path = pcVar4;
  }
  else {
    pcVar3 = strrchr(rel_path,0x2f);
    pcVar5 = pcVar3 + 1;
    if (pcVar3 == (char *)0x0) {
      pcVar5 = rel_path;
    }
    pcVar3 = "%s/%s";
    rel_path = pcVar4;
  }
  iVar1 = sprintf(mk_filename::fn,pcVar3,rel_path,pcVar5);
  return (char *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

static char *
mk_filename(uint32 type, char *rel_path)
{
    static char fn[MAXPATHLEN];
    const char *r;
    const char *e;
    char *tt;

    r = data_dir[type];
    e = extension[type];
    
    if (r && e) {
	if (is_flat[type] == FALSE) {
	    sprintf(fn, "%s/%s.%s",
		    r, rel_path, e);
	}
	else {
	    tt = strrchr(rel_path, '/');
	    if (tt) {
		++tt;
	    }
	    else {
		tt = rel_path;
	    }
	    sprintf(fn, "%s/%s.%s",  r, tt, e);
	}
    }
    else if (r) {
	if (is_flat[type] == FALSE) {
	    sprintf(fn, "%s/%s",
		    r, rel_path);
	}
	else {
	    tt = strrchr(rel_path, '/');
	    if (tt) {
		++tt;
	    }
	    else {
		tt = rel_path;
	    }
	    sprintf(fn, "%s/%s",  r, tt);
	}
    }
    else if (e) {
	sprintf(fn, "%s.%s",
		rel_path, e);
    }
    else {
	strcpy(fn, rel_path);
    }

    return fn;
}